

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_parent(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *pPVar2;
  xmlChar *local_50;
  xmlAttrPtr attr;
  xmlNodePtr res;
  xmlNodePtr cur;
  PyObject *obj;
  PyObject *resultobj;
  PyObject *args_local;
  PyObject *self_local;
  
  resultobj = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:parent",&cur);
  if (iVar1 == 0) {
    return (PyObject *)0x0;
  }
  if (cur == (xmlNodePtr)&_Py_NoneStruct) {
    local_50 = (xmlChar *)0x0;
  }
  else {
    local_50 = cur->name;
  }
  iVar1 = *(int *)(local_50 + 8);
  if (iVar1 == 2) {
    attr = *(xmlAttrPtr *)(local_50 + 0x28);
    goto LAB_0014a553;
  }
  if ((iVar1 != 9) && (iVar1 != 0xd)) {
    if (iVar1 - 0x11U < 4) {
      attr = (xmlAttrPtr)0x0;
      goto LAB_0014a553;
    }
    if (iVar1 != 0x15) {
      attr = *(xmlAttrPtr *)(local_50 + 0x28);
      goto LAB_0014a553;
    }
  }
  attr = (xmlAttrPtr)0x0;
LAB_0014a553:
  pPVar2 = libxml_xmlNodePtrWrap((xmlNodePtr)attr);
  return pPVar2;
}

Assistant:

static PyObject *
libxml_parent(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *resultobj, *obj;
    xmlNodePtr cur;
    xmlNodePtr res;

    if (!PyArg_ParseTuple(args, (char *) "O:parent", &obj))
        return NULL;
    cur = PyxmlNode_Get(obj);

#ifdef DEBUG
    printf("libxml_parent: cur = %p\n", cur);
#endif

    switch (cur->type) {
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
#ifdef LIBXML_DOCB_ENABLED
        case XML_DOCB_DOCUMENT_NODE:
#endif
            res = NULL;
            break;
        case XML_ATTRIBUTE_NODE:{
                xmlAttrPtr attr = (xmlAttrPtr) cur;

                res = attr->parent;
            }
	    break;
        case XML_ENTITY_DECL:
        case XML_NAMESPACE_DECL:
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
            res = NULL;
            break;
        default:
            res = cur->parent;
            break;
    }
    resultobj = libxml_xmlNodePtrWrap(res);
    return resultobj;
}